

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void stream_drain_callback(pa_mainloop_api *a,pa_time_event *e,timeval *tv,void *u)

{
  cubeb_stream_conflict *in_RCX;
  long in_RDI;
  cubeb_stream_conflict *stm;
  
  stream_state_change_callback(in_RCX,(cubeb_state)((ulong)in_RCX >> 0x20));
  (**(code **)(in_RDI + 0x38))(in_RCX->drain_timer);
  in_RCX->drain_timer = (pa_time_event *)0x0;
  (*cubeb_pa_threaded_mainloop_signal)(in_RCX->context->mainloop,0);
  return;
}

Assistant:

static void
stream_drain_callback(pa_mainloop_api * a, pa_time_event * e, struct timeval const * tv, void * u)
{
  (void)a;
  (void)tv;
  cubeb_stream * stm = u;
  assert(stm->drain_timer == e);
  stream_state_change_callback(stm, CUBEB_STATE_DRAINED);
  /* there's no pa_rttime_free, so use this instead. */
  a->time_free(stm->drain_timer);
  stm->drain_timer = NULL;
  WRAP(pa_threaded_mainloop_signal)(stm->context->mainloop, 0);
}